

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

void __thiscall raft_functional_common::TestMgr::save_state(TestMgr *this,srv_state *state)

{
  ptr<buffer> buf;
  undefined1 local_30 [16];
  buffer *local_20;
  
  nuraft::srv_state::serialize((srv_state *)&stack0xffffffffffffffe0);
  nuraft::srv_state::deserialize((srv_state *)local_30,local_20);
  std::__shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->savedState).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void save_state(const srv_state& state) {
        ptr<buffer> buf = state.serialize();
        savedState = srv_state::deserialize(*buf);
    }